

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# projectwriter.cpp
# Opt level: O0

void __thiscall ProjectWriter::writeJunctions(ProjectWriter *this)

{
  bool bVar1;
  int iVar2;
  _Setw _Var3;
  _Setprecision _Var4;
  vector<Node_*,_std::allocator<Node_*>_> *this_00;
  reference ppNVar5;
  ostream *poVar6;
  undefined1 *this_01;
  double dVar7;
  double dVar8;
  double pUcf;
  _Setprecision local_44;
  _Setw local_40;
  _Setw local_3c;
  Junction *local_38;
  Junction *junc;
  Node *node;
  iterator __end1;
  iterator __begin1;
  vector<Node_*,_std::allocator<Node_*>_> *__range1;
  ProjectWriter *this_local;
  
  std::operator<<((ostream *)&this->field_0x18,"\n[JUNCTIONS]\n");
  this_00 = &this->network->nodes;
  __end1 = std::vector<Node_*,_std::allocator<Node_*>_>::begin(this_00);
  node = (Node *)std::vector<Node_*,_std::allocator<Node_*>_>::end(this_00);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>
                                     *)&node), bVar1) {
    ppNVar5 = __gnu_cxx::__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
              operator*(&__end1);
    junc = (Junction *)*ppNVar5;
    iVar2 = (*(junc->super_Node).super_Element._vptr_Element[2])();
    if (iVar2 == 0) {
      local_38 = junc;
      this_01 = &this->field_0x18;
      poVar6 = (ostream *)std::ostream::operator<<(this_01,std::left);
      local_3c = std::setw(0x10);
      poVar6 = std::operator<<(poVar6,local_3c);
      poVar6 = std::operator<<(poVar6,(string *)&(junc->super_Node).super_Element.name);
      std::operator<<(poVar6," ");
      local_40 = std::setw(0xc);
      poVar6 = std::operator<<((ostream *)this_01,local_40);
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,std::fixed);
      local_44 = std::setprecision(4);
      std::operator<<(poVar6,local_44);
      dVar8 = (junc->super_Node).elev;
      dVar7 = Network::ucf(this->network,LENGTH);
      std::ostream::operator<<(this_01,dVar8 * dVar7);
      Network::option_abi_cxx11_((Network *)&stack0xffffffffffffff98,(StringOption)this->network);
      bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &stack0xffffffffffffff98,"FIXED");
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff98);
      if (bVar1) {
        std::operator<<((ostream *)&this->field_0x18,"*     *    ");
        dVar8 = Network::ucf(this->network,PRESSURE);
        _Var3 = std::setw(0xc);
        poVar6 = std::operator<<((ostream *)&this->field_0x18,_Var3);
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,std::fixed);
        _Var4 = std::setprecision(4);
        std::operator<<(poVar6,_Var4);
        std::ostream::operator<<(&this->field_0x18,local_38->pMin * dVar8);
        _Var3 = std::setw(0xc);
        poVar6 = std::operator<<((ostream *)&this->field_0x18,_Var3);
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,std::fixed);
        _Var4 = std::setprecision(4);
        std::operator<<(poVar6,_Var4);
        std::ostream::operator<<(&this->field_0x18,local_38->pFull * dVar8);
      }
      std::operator<<((ostream *)&this->field_0x18,"\n");
    }
    __gnu_cxx::__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>::operator++
              (&__end1);
  }
  return;
}

Assistant:

void ProjectWriter::writeJunctions()
{
    fout << "\n[JUNCTIONS]\n";
    for (Node* node : network->nodes)
    {
        if ( node->type() == Node::JUNCTION )
        {
            Junction* junc = static_cast<Junction*>(node);
            fout << left << setw(16) << node->name << " ";
            fout << setw(12) << fixed << setprecision(4);
            fout << node->elev*network->ucf(Units::LENGTH);

            if (network->option(Options::DEMAND_MODEL) != "FIXED" )
            {
                fout << "*     *    "; //Blank fields for primary demand and pattern
                double pUcf = network->ucf(Units::PRESSURE);
                fout << setw(12) << fixed << setprecision(4);
                fout << junc->pMin * pUcf;
                fout << setw(12) << fixed << setprecision(4);
                fout << junc->pFull * pUcf;
            }
            fout <<  "\n";
        }
    }
}